

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O0

void http2_stream_free(HTTP *http)

{
  HTTP *http_local;
  
  if (http != (HTTP *)0x0) {
    Curl_dyn_free(&http->header_recvbuf);
    while (http->push_headers_used != 0) {
      (*Curl_cfree)(http->push_headers[http->push_headers_used - 1]);
      http->push_headers_used = http->push_headers_used - 1;
    }
    (*Curl_cfree)(http->push_headers);
    http->push_headers = (char **)0x0;
  }
  return;
}

Assistant:

static void http2_stream_free(struct HTTP *http)
{
  if(http) {
    Curl_dyn_free(&http->header_recvbuf);
    for(; http->push_headers_used > 0; --http->push_headers_used) {
      free(http->push_headers[http->push_headers_used - 1]);
    }
    free(http->push_headers);
    http->push_headers = NULL;
  }
}